

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O0

REF_STATUS
ref_phys_yplus_metric
          (REF_GRID ref_grid,REF_DBL *metric,REF_DBL mach,REF_DBL re,REF_DBL temperature,
          REF_DBL target,REF_INT ldim,REF_DBL *field,REF_DICT ref_dict_bcs,
          REF_BOOL sample_viscous_length_error)

{
  int iVar1;
  int iVar2;
  REF_DBL RVar3;
  REF_DBL RVar4;
  REF_DBL RVar5;
  REF_STATUS RVar6;
  REF_BOOL RVar7;
  uint uVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double local_2d8;
  double local_2d0;
  double local_2c8;
  double local_2c0;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_INT node1;
  REF_INT node0;
  REF_INT edge;
  REF_EDGE ref_edge;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rxs;
  REF_DBL equilateral_altitude;
  REF_DBL diff;
  REF_DBL s2;
  REF_DBL s1;
  REF_DBL l2;
  REF_DBL l1;
  REF_DBL err2;
  REF_DBL err1;
  REF_DBL logm [6];
  REF_DBL m [6];
  REF_DBL d [12];
  REF_DBL ratio;
  REF_DBL h1;
  REF_DBL h0;
  REF_DBL mh;
  REF_DBL edg_norm [3];
  int local_128 [2];
  REF_INT edg_nodes [27];
  REF_INT local_b4;
  REF_INT edg;
  REF_INT bc;
  REF_CELL edg_cell;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT ref_malloc_init_i_3;
  REF_INT ref_malloc_init_i_2;
  REF_INT ref_malloc_init_i_1;
  REF_INT ref_malloc_init_i;
  REF_INT i;
  REF_INT node;
  REF_INT *hits;
  REF_DBL *new_log_metric;
  REF_DBL *lengthscale2;
  REF_DBL *lengthscale;
  REF_NODE ref_node;
  REF_DICT pRStack_58;
  REF_BOOL sample_viscous_length_error_local;
  REF_DICT ref_dict_bcs_local;
  REF_DBL *field_local;
  REF_DBL RStack_40;
  REF_INT ldim_local;
  REF_DBL target_local;
  REF_DBL temperature_local;
  REF_DBL re_local;
  REF_DBL mach_local;
  REF_DBL *metric_local;
  REF_GRID ref_grid_local;
  
  lengthscale = (REF_DBL *)ref_grid->node;
  ref_node._4_4_ = sample_viscous_length_error;
  pRStack_58 = ref_dict_bcs;
  ref_dict_bcs_local = (REF_DICT)field;
  field_local._4_4_ = ldim;
  RStack_40 = target;
  target_local = temperature;
  temperature_local = re;
  re_local = mach;
  mach_local = (REF_DBL)metric;
  metric_local = (REF_DBL *)ref_grid;
  if (((REF_NODE)lengthscale)->max < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x40e,
           "ref_phys_yplus_metric","malloc hits of REF_INT negative");
    ref_grid_local._4_4_ = 1;
  }
  else {
    _i = (REF_INT *)malloc((long)((REF_NODE)lengthscale)->max << 2);
    if (_i == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x40e,
             "ref_phys_yplus_metric","malloc hits of REF_INT NULL");
      ref_grid_local._4_4_ = 2;
    }
    else {
      for (ref_malloc_init_i_2 = 0; ref_malloc_init_i_2 < *(int *)((long)lengthscale + 4);
          ref_malloc_init_i_2 = ref_malloc_init_i_2 + 1) {
        _i[ref_malloc_init_i_2] = 0;
      }
      if (*(int *)((long)lengthscale + 4) * 6 < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
               0x40f,"ref_phys_yplus_metric","malloc new_log_metric of REF_DBL negative");
        ref_grid_local._4_4_ = 1;
      }
      else {
        hits = (REF_INT *)malloc((long)(*(int *)((long)lengthscale + 4) * 6) << 3);
        if (hits == (REF_INT *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                 0x40f,"ref_phys_yplus_metric","malloc new_log_metric of REF_DBL NULL");
          ref_grid_local._4_4_ = 2;
        }
        else {
          for (ref_malloc_init_i_3 = 0;
              SBORROW4(ref_malloc_init_i_3,*(int *)((long)lengthscale + 4) * 6) !=
              ref_malloc_init_i_3 + *(int *)((long)lengthscale + 4) * -6 < 0;
              ref_malloc_init_i_3 = ref_malloc_init_i_3 + 1) {
            (hits + (long)ref_malloc_init_i_3 * 2)[0] = 0;
            (hits + (long)ref_malloc_init_i_3 * 2)[1] = 0;
          }
          if (*(int *)((long)lengthscale + 4) < 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                   0x410,"ref_phys_yplus_metric","malloc lengthscale of REF_DBL negative");
            ref_grid_local._4_4_ = 1;
          }
          else {
            lengthscale2 = (REF_DBL *)malloc((long)*(int *)((long)lengthscale + 4) << 3);
            if (lengthscale2 == (REF_DBL *)0x0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                     ,0x410,"ref_phys_yplus_metric","malloc lengthscale of REF_DBL NULL");
              ref_grid_local._4_4_ = 2;
            }
            else {
              for (ref_private_macro_code_rss = 0;
                  ref_private_macro_code_rss < *(int *)((long)lengthscale + 4);
                  ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
                lengthscale2[ref_private_macro_code_rss] = 0.0;
              }
              if (*(int *)((long)lengthscale + 4) < 0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                       ,0x411,"ref_phys_yplus_metric","malloc lengthscale2 of REF_DBL negative");
                ref_grid_local._4_4_ = 1;
              }
              else {
                new_log_metric = (REF_DBL *)malloc((long)*(int *)((long)lengthscale + 4) << 3);
                if (new_log_metric == (REF_DBL *)0x0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                         ,0x411,"ref_phys_yplus_metric","malloc lengthscale2 of REF_DBL NULL");
                  ref_grid_local._4_4_ = 2;
                }
                else {
                  for (ref_private_macro_code_rss_1 = 0;
                      ref_private_macro_code_rss_1 < *(int *)((long)lengthscale + 4);
                      ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
                    new_log_metric[ref_private_macro_code_rss_1] = 0.0;
                  }
                  edg_cell._4_4_ =
                       ref_phys_yplus_lengthscale
                                 ((REF_GRID)metric_local,re_local,temperature_local,target_local,
                                  field_local._4_4_,(REF_DBL *)ref_dict_bcs_local,lengthscale2);
                  if (edg_cell._4_4_ == 0) {
                    edg_cell._0_4_ =
                         ref_phys_yplus_lengthscale2
                                   ((REF_GRID)metric_local,re_local,temperature_local,target_local,
                                    field_local._4_4_,(REF_DBL *)ref_dict_bcs_local,new_log_metric);
                    if ((uint)edg_cell == 0) {
                      if (*(int *)(metric_local + 0x21) == 0) {
                        ref_private_macro_code_rss_7 = 6;
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                               ,0x45a,"ref_phys_yplus_metric",6,"implement 3D");
                        ref_grid_local._4_4_ = ref_private_macro_code_rss_7;
                      }
                      else {
                        _edg = (REF_CELL)metric_local[2];
                        err2 = 0.1;
                        l1 = 0.2;
                        _ref_private_macro_code_rss_2 = 0.866025403784439;
                        edg_cell._0_4_ = 0;
                        for (edg_nodes[0x1a] = 0; edg_nodes[0x1a] < _edg->max;
                            edg_nodes[0x1a] = edg_nodes[0x1a] + 1) {
                          RVar6 = ref_cell_nodes(_edg,edg_nodes[0x1a],local_128);
                          if (RVar6 == 0) {
                            local_b4 = -1;
                            ref_private_macro_code_rss_3 =
                                 ref_dict_value(pRStack_58,local_128[_edg->node_per],&local_b4);
                            if ((ref_private_macro_code_rss_3 != 0) &&
                               (ref_private_macro_code_rss_3 != 5)) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                     ,0x426,"ref_phys_yplus_metric",
                                     (ulong)(uint)ref_private_macro_code_rss_3,"bc");
                              return ref_private_macro_code_rss_3;
                            }
                            RVar7 = ref_phys_wall_distance_bc(local_b4);
                            if (RVar7 != 0) {
                              ref_private_macro_code_rss_4 =
                                   ref_layer_interior_seg_normal
                                             ((REF_GRID)metric_local,edg_nodes[0x1a],&mh);
                              RVar5 = edg_norm[1];
                              RVar4 = edg_norm[0];
                              RVar3 = mh;
                              if (ref_private_macro_code_rss_4 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                       ,0x428,"ref_phys_yplus_metric",
                                       (ulong)(uint)ref_private_macro_code_rss_4,"edge norm");
                                return ref_private_macro_code_rss_4;
                              }
                              dVar10 = sqrt(edg_norm[1] *
                                            (*(double *)
                                              ((long)mach_local + 0x28 +
                                              (long)(local_128[0] * 6) * 8) * edg_norm[1] +
                                            *(double *)
                                             ((long)mach_local + 0x10 + (long)(local_128[0] * 6) * 8
                                             ) * mh + *(double *)
                                                       ((long)mach_local + 0x20 +
                                                       (long)(local_128[0] * 6) * 8) * edg_norm[0])
                                            + mh * (*(double *)
                                                     ((long)mach_local + 0x10 +
                                                     (long)(local_128[0] * 6) * 8) * edg_norm[1] +
                                                   *(double *)
                                                    ((long)mach_local + (long)(local_128[0] * 6) * 8
                                                    ) * mh + *(double *)
                                                              ((long)mach_local + 8 +
                                                              (long)(local_128[0] * 6) * 8) *
                                                             edg_norm[0]) +
                                              edg_norm[0] *
                                              (*(double *)
                                                ((long)mach_local + 0x20 +
                                                (long)(local_128[0] * 6) * 8) * edg_norm[1] +
                                              *(double *)
                                               ((long)mach_local + 8 + (long)(local_128[0] * 6) * 8)
                                              * mh + *(double *)
                                                      ((long)mach_local + 0x18 +
                                                      (long)(local_128[0] * 6) * 8) * edg_norm[0]));
                              dVar11 = sqrt(edg_norm[1] *
                                            (*(double *)
                                              ((long)mach_local + 0x28 +
                                              (long)(local_128[1] * 6) * 8) * edg_norm[1] +
                                            *(double *)
                                             ((long)mach_local + 0x10 + (long)(local_128[1] * 6) * 8
                                             ) * mh + *(double *)
                                                       ((long)mach_local + 0x20 +
                                                       (long)(local_128[1] * 6) * 8) * edg_norm[0])
                                            + mh * (*(double *)
                                                     ((long)mach_local + 0x10 +
                                                     (long)(local_128[1] * 6) * 8) * edg_norm[1] +
                                                   *(double *)
                                                    ((long)mach_local + (long)(local_128[1] * 6) * 8
                                                    ) * mh + *(double *)
                                                              ((long)mach_local + 8 +
                                                              (long)(local_128[1] * 6) * 8) *
                                                             edg_norm[0]) +
                                              edg_norm[0] *
                                              (*(double *)
                                                ((long)mach_local + 0x20 +
                                                (long)(local_128[1] * 6) * 8) * edg_norm[1] +
                                              *(double *)
                                               ((long)mach_local + 8 + (long)(local_128[1] * 6) * 8)
                                              * mh + *(double *)
                                                      ((long)mach_local + 0x18 +
                                                      (long)(local_128[1] * 6) * 8) * edg_norm[0]));
                              dVar10 = 1.0 / ((dVar10 + dVar11) * 0.5);
                              l2 = (lengthscale2[local_128[0]] + lengthscale2[local_128[1]]) * 0.5;
                              s1 = (new_log_metric[local_128[0]] + new_log_metric[local_128[1]]) *
                                   0.5;
                              if (s1 - l2 <= 0.0) {
                                local_2c0 = -(s1 - l2);
                              }
                              else {
                                local_2c0 = s1 - l2;
                              }
                              equilateral_altitude = local_2c0 / l2;
                              if (equilateral_altitude - err2 <= 0.0) {
                                local_2c8 = 0.0;
                              }
                              else {
                                local_2c8 = equilateral_altitude - err2;
                              }
                              if (1.0 <= local_2c8 / (l1 - err2)) {
                                local_2d8 = 1.0;
                              }
                              else {
                                if (equilateral_altitude - err2 <= 0.0) {
                                  local_2d0 = 0.0;
                                }
                                else {
                                  local_2d0 = equilateral_altitude - err2;
                                }
                                local_2d8 = local_2d0 / (l1 - err2);
                              }
                              diff = local_2d8;
                              s2 = 1.0 - local_2d8;
                              h1 = local_2d8 * dVar10 +
                                   (s2 * RStack_40 * l2) / _ref_private_macro_code_rss_2;
                              if (ref_node._4_4_ == 0) {
                                h1 = (RStack_40 * l2) / _ref_private_macro_code_rss_2;
                              }
                              m[5] = 1.0 / (h1 * h1);
                              printf("x %.4f l1 %.3e l2 %.3e diff %.4f s %.2f %.2f t %.3e m %.3e h %.3e\n"
                                     ,(*(double *)
                                        (*(long *)((long)metric_local[1] + 0x38) +
                                        (long)(local_128[0] * 0xf) * 8) +
                                      *(double *)
                                       (*(long *)((long)metric_local[1] + 0x38) +
                                       (long)(local_128[1] * 0xf) * 8)) * 0.5,l2,s1,
                                     equilateral_altitude,s2,local_2d8,
                                     (RStack_40 * l2) / _ref_private_macro_code_rss_2,dVar10);
                              dVar10 = RVar5 * 0.0 + -(RVar4 * 1.0);
                              dVar11 = RVar3 * 1.0 + -(RVar5 * 0.0);
                              dVar12 = RVar4 * 0.0 + -(RVar3 * 0.0);
                              sqrt(dVar12 * (*(double *)
                                              ((long)mach_local + 0x28 +
                                              (long)(local_128[0] * 6) * 8) * dVar12 +
                                            *(double *)
                                             ((long)mach_local + 0x10 + (long)(local_128[0] * 6) * 8
                                             ) * dVar10 +
                                            *(double *)
                                             ((long)mach_local + 0x20 + (long)(local_128[0] * 6) * 8
                                             ) * dVar11) +
                                   dVar10 * (*(double *)
                                              ((long)mach_local + 0x10 +
                                              (long)(local_128[0] * 6) * 8) * dVar12 +
                                            *(double *)
                                             ((long)mach_local + (long)(local_128[0] * 6) * 8) *
                                            dVar10 + *(double *)
                                                      ((long)mach_local + 8 +
                                                      (long)(local_128[0] * 6) * 8) * dVar11) +
                                   dVar11 * (*(double *)
                                              ((long)mach_local + 0x20 +
                                              (long)(local_128[0] * 6) * 8) * dVar12 +
                                            *(double *)
                                             ((long)mach_local + 8 + (long)(local_128[0] * 6) * 8) *
                                            dVar10 + *(double *)
                                                      ((long)mach_local + 0x18 +
                                                      (long)(local_128[0] * 6) * 8) * dVar11));
                              sqrt(dVar12 * (*(double *)
                                              ((long)mach_local + 0x28 +
                                              (long)(local_128[1] * 6) * 8) * dVar12 +
                                            *(double *)
                                             ((long)mach_local + 0x10 + (long)(local_128[1] * 6) * 8
                                             ) * dVar10 +
                                            *(double *)
                                             ((long)mach_local + 0x20 + (long)(local_128[1] * 6) * 8
                                             ) * dVar11) +
                                   dVar10 * (*(double *)
                                              ((long)mach_local + 0x10 +
                                              (long)(local_128[1] * 6) * 8) * dVar12 +
                                            *(double *)
                                             ((long)mach_local + (long)(local_128[1] * 6) * 8) *
                                            dVar10 + *(double *)
                                                      ((long)mach_local + 8 +
                                                      (long)(local_128[1] * 6) * 8) * dVar11) +
                                   dVar11 * (*(double *)
                                              ((long)mach_local + 0x20 +
                                              (long)(local_128[1] * 6) * 8) * dVar12 +
                                            *(double *)
                                             ((long)mach_local + 8 + (long)(local_128[1] * 6) * 8) *
                                            dVar10 + *(double *)
                                                      ((long)mach_local + 0x18 +
                                                      (long)(local_128[1] * 6) * 8) * dVar11));
                              ref_private_macro_code_rss_5 = ref_matrix_form_m(m + 5,logm + 5);
                              if (ref_private_macro_code_rss_5 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                       ,0x44e,"ref_phys_yplus_metric",
                                       (ulong)(uint)ref_private_macro_code_rss_5,"form",h1);
                                return ref_private_macro_code_rss_5;
                              }
                              ref_private_macro_code_rss_6 = ref_matrix_log_m(logm + 5,&err1);
                              if (ref_private_macro_code_rss_6 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                       ,0x44f,"ref_phys_yplus_metric",
                                       (ulong)(uint)ref_private_macro_code_rss_6,"form");
                                return ref_private_macro_code_rss_6;
                              }
                              for (ref_malloc_init_i_1 = 0; ref_malloc_init_i_1 < 6;
                                  ref_malloc_init_i_1 = ref_malloc_init_i_1 + 1) {
                                lVar9 = (long)(ref_malloc_init_i_1 + local_128[0] * 6);
                                *(double *)(hits + lVar9 * 2) =
                                     logm[(long)ref_malloc_init_i_1 + -1] +
                                     *(double *)(hits + lVar9 * 2);
                              }
                              _i[local_128[0]] = _i[local_128[0]] + 1;
                              for (ref_malloc_init_i_1 = 0; ref_malloc_init_i_1 < 6;
                                  ref_malloc_init_i_1 = ref_malloc_init_i_1 + 1) {
                                lVar9 = (long)(ref_malloc_init_i_1 + local_128[1] * 6);
                                *(double *)(hits + lVar9 * 2) =
                                     logm[(long)ref_malloc_init_i_1 + -1] +
                                     *(double *)(hits + lVar9 * 2);
                              }
                              _i[local_128[1]] = _i[local_128[1]] + 1;
                              ref_private_macro_code_rss_6 = 0;
                            }
                          }
                        }
                        ref_private_macro_code_rss_8 =
                             ref_node_ghost_dbl((REF_NODE)lengthscale,(REF_DBL *)hits,6);
                        if (ref_private_macro_code_rss_8 == 0) {
                          ref_edge._4_4_ = ref_node_ghost_int((REF_NODE)lengthscale,_i,1);
                          if (ref_edge._4_4_ == 0) {
                            ref_edge._4_4_ = 0;
                            for (ref_malloc_init_i = 0;
                                ref_malloc_init_i < *(int *)((long)lengthscale + 4);
                                ref_malloc_init_i = ref_malloc_init_i + 1) {
                              if ((((-1 < ref_malloc_init_i) &&
                                   (ref_malloc_init_i < *(int *)((long)lengthscale + 4))) &&
                                  (-1 < *(long *)((long)lengthscale[2] + (long)ref_malloc_init_i * 8
                                                 ))) && (0 < _i[ref_malloc_init_i])) {
                                for (ref_malloc_init_i_1 = 0; ref_malloc_init_i_1 < 6;
                                    ref_malloc_init_i_1 = ref_malloc_init_i_1 + 1) {
                                  lVar9 = (long)(ref_malloc_init_i_1 + ref_malloc_init_i * 6);
                                  *(double *)(hits + lVar9 * 2) =
                                       *(double *)(hits + lVar9 * 2) / (double)_i[ref_malloc_init_i]
                                  ;
                                }
                                _i[ref_malloc_init_i] = -1;
                                ref_edge._0_4_ =
                                     ref_matrix_exp_m((REF_DBL *)
                                                      (hits + (long)(ref_malloc_init_i * 6) * 2),
                                                      (REF_DBL *)
                                                      ((long)mach_local +
                                                      (long)(ref_malloc_init_i * 6) * 8));
                                if ((uint)ref_edge != 0) {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                         ,0x467,"ref_phys_yplus_metric",(ulong)(uint)ref_edge,"form"
                                        );
                                  return (uint)ref_edge;
                                }
                                ref_edge._0_4_ = 0;
                              }
                            }
                            uVar8 = ref_edge_create((REF_EDGE *)&node0,(REF_GRID)metric_local);
                            if (uVar8 == 0) {
                              for (node1 = 0; node1 < _node0->n; node1 = node1 + 1) {
                                iVar1 = _node0->e2n[node1 << 1];
                                iVar2 = _node0->e2n[node1 * 2 + 1];
                                if ((-1 < _i[iVar1]) && (_i[iVar2] == -1)) {
                                  for (ref_malloc_init_i_1 = 0; ref_malloc_init_i_1 < 6;
                                      ref_malloc_init_i_1 = ref_malloc_init_i_1 + 1) {
                                    lVar9 = (long)(ref_malloc_init_i_1 + iVar1 * 6);
                                    *(double *)(hits + lVar9 * 2) =
                                         *(double *)
                                          (hits + (long)(ref_malloc_init_i_1 + iVar2 * 6) * 2) +
                                         *(double *)(hits + lVar9 * 2);
                                  }
                                  _i[iVar1] = _i[iVar1] + 1;
                                }
                                if ((-1 < _i[iVar2]) && (_i[iVar1] == -1)) {
                                  for (ref_malloc_init_i_1 = 0; ref_malloc_init_i_1 < 6;
                                      ref_malloc_init_i_1 = ref_malloc_init_i_1 + 1) {
                                    lVar9 = (long)(ref_malloc_init_i_1 + iVar2 * 6);
                                    *(double *)(hits + lVar9 * 2) =
                                         *(double *)
                                          (hits + (long)(ref_malloc_init_i_1 + iVar1 * 6) * 2) +
                                         *(double *)(hits + lVar9 * 2);
                                  }
                                  _i[iVar2] = _i[iVar2] + 1;
                                }
                              }
                              ref_edge_free(_node0);
                              uVar8 = ref_node_ghost_dbl((REF_NODE)lengthscale,(REF_DBL *)hits,6);
                              if (uVar8 == 0) {
                                uVar8 = ref_node_ghost_int((REF_NODE)lengthscale,_i,1);
                                if (uVar8 == 0) {
                                  for (ref_malloc_init_i = 0;
                                      ref_malloc_init_i < *(int *)((long)lengthscale + 4);
                                      ref_malloc_init_i = ref_malloc_init_i + 1) {
                                    if ((((-1 < ref_malloc_init_i) &&
                                         (ref_malloc_init_i < *(int *)((long)lengthscale + 4))) &&
                                        (-1 < *(long *)((long)lengthscale[2] +
                                                       (long)ref_malloc_init_i * 8))) &&
                                       (0 < _i[ref_malloc_init_i])) {
                                      for (ref_malloc_init_i_1 = 0; ref_malloc_init_i_1 < 6;
                                          ref_malloc_init_i_1 = ref_malloc_init_i_1 + 1) {
                                        lVar9 = (long)(ref_malloc_init_i_1 + ref_malloc_init_i * 6);
                                        *(double *)(hits + lVar9 * 2) =
                                             *(double *)(hits + lVar9 * 2) /
                                             (double)_i[ref_malloc_init_i];
                                      }
                                      _i[ref_malloc_init_i] = -2;
                                      uVar8 = ref_matrix_exp_m((REF_DBL *)
                                                               (hits + (long)(ref_malloc_init_i * 6)
                                                                       * 2),
                                                               (REF_DBL *)
                                                               ((long)mach_local +
                                                               (long)(ref_malloc_init_i * 6) * 8));
                                      if (uVar8 != 0) {
                                        printf("%s: %d: %s: %d %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                               ,0x48c,"ref_phys_yplus_metric",(ulong)uVar8,"form");
                                        return uVar8;
                                      }
                                    }
                                  }
                                  uVar8 = ref_node_ghost_dbl((REF_NODE)lengthscale,
                                                             (REF_DBL *)mach_local,6);
                                  if (uVar8 == 0) {
                                    if (new_log_metric != (REF_DBL *)0x0) {
                                      free(new_log_metric);
                                    }
                                    if (lengthscale2 != (REF_DBL *)0x0) {
                                      free(lengthscale2);
                                    }
                                    if (hits != (REF_INT *)0x0) {
                                      free(hits);
                                    }
                                    if (_i != (REF_INT *)0x0) {
                                      free(_i);
                                    }
                                    ref_grid_local._4_4_ = 0;
                                  }
                                  else {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                           ,0x490,"ref_phys_yplus_metric",(ulong)uVar8,
                                           "ghost metric");
                                    ref_grid_local._4_4_ = uVar8;
                                  }
                                }
                                else {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                         ,0x483,"ref_phys_yplus_metric",(ulong)uVar8,"ghost hits");
                                  ref_grid_local._4_4_ = uVar8;
                                }
                              }
                              else {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                       ,0x482,"ref_phys_yplus_metric",(ulong)uVar8,"ghost metric");
                                ref_grid_local._4_4_ = uVar8;
                              }
                            }
                            else {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                     ,0x46e,"ref_phys_yplus_metric",(ulong)uVar8,"orig edges");
                              ref_grid_local._4_4_ = uVar8;
                            }
                          }
                          else {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                   ,0x45e,"ref_phys_yplus_metric",(ulong)ref_edge._4_4_,"ghost hits"
                                  );
                            ref_grid_local._4_4_ = ref_edge._4_4_;
                          }
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                 ,0x45d,"ref_phys_yplus_metric",
                                 (ulong)(uint)ref_private_macro_code_rss_8,"ghost metric");
                          ref_grid_local._4_4_ = ref_private_macro_code_rss_8;
                        }
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                             ,0x417,"ref_phys_yplus_metric",(ulong)(uint)edg_cell,"length scale");
                      ref_grid_local._4_4_ = (uint)edg_cell;
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                           ,0x414,"ref_phys_yplus_metric",(ulong)edg_cell._4_4_,"length scale");
                    ref_grid_local._4_4_ = edg_cell._4_4_;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_phys_yplus_metric(REF_GRID ref_grid, REF_DBL *metric,
                                         REF_DBL mach, REF_DBL re,
                                         REF_DBL temperature, REF_DBL target,
                                         REF_INT ldim, REF_DBL *field,
                                         REF_DICT ref_dict_bcs,
                                         REF_BOOL sample_viscous_length_error) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL *lengthscale, *lengthscale2, *new_log_metric;
  REF_INT *hits;
  REF_INT node, i;
  ref_malloc_init(hits, ref_node_max(ref_node), REF_INT, 0);
  ref_malloc_init(new_log_metric, 6 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(lengthscale, ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(lengthscale2, ref_node_max(ref_node), REF_DBL, 0.0);
  RSS(ref_phys_yplus_lengthscale(ref_grid, mach, re, temperature, ldim, field,
                                 lengthscale),
      "length scale");
  RSS(ref_phys_yplus_lengthscale2(ref_grid, mach, re, temperature, ldim, field,
                                  lengthscale2),
      "length scale");
  if (ref_grid_twod(ref_grid)) {
    REF_CELL edg_cell = ref_grid_edg(ref_grid);
    REF_INT bc;
    REF_INT edg, edg_nodes[REF_CELL_MAX_SIZE_PER];
    REF_DBL edg_norm[3], mh, h0, h1, ratio;
    REF_DBL d[12], m[6], logm[6];
    REF_DBL err1 = 0.10, err2 = 0.20;
    REF_DBL l1, l2, s1, s2, diff;
    REF_DBL equilateral_altitude =
        0.866025403784439; /* sqrt(3.0)/2 altitude of equalateral triangle */
    each_ref_cell_valid_cell_with_nodes(edg_cell, edg, edg_nodes) {
      bc = REF_EMPTY;
      RXS(ref_dict_value(ref_dict_bcs, edg_nodes[ref_cell_id_index(edg_cell)],
                         &bc),
          REF_NOT_FOUND, "bc");
      if (!ref_phys_wall_distance_bc(bc)) continue;
      RSS(ref_layer_interior_seg_normal(ref_grid, edg, edg_norm), "edge norm");
      ref_matrix_vec(d, 0, 0) = edg_norm[0];
      ref_matrix_vec(d, 1, 0) = edg_norm[1];
      ref_matrix_vec(d, 2, 0) = edg_norm[2];
      ratio =
          0.5 * (ref_matrix_sqrt_vt_m_v(&(metric[6 * edg_nodes[0]]), edg_norm) +
                 ref_matrix_sqrt_vt_m_v(&(metric[6 * edg_nodes[1]]), edg_norm));
      mh = 1.0 / ratio;
      l1 = 0.5 * (lengthscale[edg_nodes[0]] + lengthscale[edg_nodes[1]]);
      l2 = 0.5 * (lengthscale2[edg_nodes[0]] + lengthscale2[edg_nodes[1]]);
      diff = ABS(l2 - l1) / l1;
      s2 = MIN(MAX(diff - err1, 0.0) / (err2 - err1), 1.0);
      s1 = 1.0 - s2;
      h0 = (s1 * target * l1 / equilateral_altitude + s2 * mh);
      if (!sample_viscous_length_error) {
        h0 = target * l1 / equilateral_altitude;
      }
      ref_matrix_eig(d, 0) = 1.0 / (h0 * h0);

      printf(
          "x %.4f l1 %.3e l2 %.3e diff %.4f s %.2f %.2f t %.3e m %.3e h %.3e\n",
          0.5 * (ref_node_xyz(ref_grid_node(ref_grid), 0, edg_nodes[0]) +
                 ref_node_xyz(ref_grid_node(ref_grid), 0, edg_nodes[1])),
          l1, l2, diff, s1, s2, target * l1 / equilateral_altitude, mh, h0);

      ref_matrix_vec(d, 0, 2) = 0.0;
      ref_matrix_vec(d, 1, 2) = 0.0;
      ref_matrix_vec(d, 2, 2) = 1.0;
      ref_matrix_eig(d, 2) = 1.0;

      ref_math_cross_product(ref_matrix_vec_ptr(d, 2), ref_matrix_vec_ptr(d, 0),
                             ref_matrix_vec_ptr(d, 1));
      ratio = 0.5 * (ref_matrix_sqrt_vt_m_v(&(metric[6 * edg_nodes[0]]),
                                            ref_matrix_vec_ptr(d, 1)) +
                     ref_matrix_sqrt_vt_m_v(&(metric[6 * edg_nodes[1]]),
                                            ref_matrix_vec_ptr(d, 1)));
      h1 = 1.0 / ratio;
      ref_matrix_eig(d, 1) = 1.0 / (h1 * h1);
      RSS(ref_matrix_form_m(d, m), "form");
      RSS(ref_matrix_log_m(m, logm), "form");
      for (i = 0; i < 6; i++) {
        new_log_metric[i + 6 * edg_nodes[0]] += logm[i];
      }
      hits[edg_nodes[0]] += 1;
      for (i = 0; i < 6; i++) {
        new_log_metric[i + 6 * edg_nodes[1]] += logm[i];
      }
      hits[edg_nodes[1]] += 1;
    }
  } else {
    RSS(REF_IMPLEMENT, "implement 3D");
  }

  RSS(ref_node_ghost_dbl(ref_node, new_log_metric, 6), "ghost metric");
  RSS(ref_node_ghost_int(ref_node, hits, 1), "ghost hits");

  each_ref_node_valid_node(ref_node, node) {
    if (hits[node] > 0) {
      for (i = 0; i < 6; i++) {
        new_log_metric[i + 6 * node] /= (REF_DBL)hits[node];
      }
      hits[node] = -1;
      RSS(ref_matrix_exp_m(&(new_log_metric[6 * node]), &(metric[6 * node])),
          "form");
    }
  }

  {
    REF_EDGE ref_edge;
    REF_INT edge, node0, node1;
    RSS(ref_edge_create(&ref_edge, ref_grid), "orig edges");
    for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
      node0 = ref_edge_e2n(ref_edge, 0, edge);
      node1 = ref_edge_e2n(ref_edge, 1, edge);
      if (0 <= hits[node0] && -1 == hits[node1]) {
        for (i = 0; i < 6; i++) {
          new_log_metric[i + 6 * node0] += new_log_metric[i + 6 * node1];
        }
        hits[node0] += 1;
      }
      if (0 <= hits[node1] && -1 == hits[node0]) {
        for (i = 0; i < 6; i++) {
          new_log_metric[i + 6 * node1] += new_log_metric[i + 6 * node0];
        }
        hits[node1] += 1;
      }
    }
    ref_edge_free(ref_edge);
  }

  RSS(ref_node_ghost_dbl(ref_node, new_log_metric, 6), "ghost metric");
  RSS(ref_node_ghost_int(ref_node, hits, 1), "ghost hits");

  each_ref_node_valid_node(ref_node, node) {
    if (hits[node] > 0) {
      for (i = 0; i < 6; i++) {
        new_log_metric[i + 6 * node] /= (REF_DBL)hits[node];
      }
      hits[node] = -2;
      RSS(ref_matrix_exp_m(&(new_log_metric[6 * node]), &(metric[6 * node])),
          "form");
    }
  }

  RSS(ref_node_ghost_dbl(ref_node, metric, 6), "ghost metric");

  ref_free(lengthscale2);
  ref_free(lengthscale);
  ref_free(new_log_metric);
  ref_free(hits);
  return REF_SUCCESS;
}